

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase383::run(TestCase383 *this)

{
  undefined8 uVar1;
  int *piVar2;
  ErrorHandler *pEVar3;
  RequestHook *pRVar4;
  ClientHook *pCVar5;
  long *plVar6;
  int __flags;
  undefined8 *puVar7;
  char *pcVar8;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  long lVar9;
  Own<capnp::ClientHook,_std::nullptr_t> OVar10;
  Client CVar11;
  Own<kj::NetworkAddress,_std::nullptr_t> address;
  int callCount;
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  Promise<void> listenPromise;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  Client cap;
  AsyncIoContext ioContext;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  TwoPartyServer server;
  TwoPartyClient client;
  char *pcVar12;
  undefined *puVar13;
  undefined8 uVar14;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_618;
  long *plStack_610;
  undefined1 local_604 [4];
  DebugComparison<int,_int_&> local_600;
  int local_5d8;
  undefined8 *local_5d0;
  long *local_5c8;
  undefined1 local_5c0 [24];
  OwnPromiseNode local_5a8;
  undefined1 local_5a0 [16];
  ErrorHandler *local_590;
  undefined1 local_588 [32];
  char *pcStack_568;
  bool local_560;
  undefined7 uStack_55f;
  undefined1 local_558 [16];
  long *plStack_548;
  Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_> local_540;
  undefined8 *local_528;
  long *local_520;
  undefined8 *local_518;
  long *local_510;
  undefined1 local_4f8 [48];
  RequestHook *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined *puStack_4b0;
  void *local_4a8;
  char *local_4a0;
  undefined *puStack_498;
  void *local_490;
  char *local_488;
  undefined *puStack_480;
  void *local_478;
  char *local_470;
  undefined *puStack_468;
  void *local_460;
  ArrayPtr<const_char> local_458;
  TwoPartyServer local_448;
  PointerReader local_3e0;
  Maybe<capnp::MessageSize> local_3c0;
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 local_3a8 [2];
  RpcSystemBase local_40;
  
  kj::setupAsyncIo();
  local_604 = (undefined1  [4])0x0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_600,(int *)local_604);
  local_3a8[0].value.ownFile.content.ptr = local_600._0_8_;
  local_3a8[0]._8_8_ = local_600.right + 6;
  if (local_600.right == (int *)0x0) {
    local_3a8[0]._8_8_ = (long *)0x0;
  }
  local_600.right = (int *)0x0;
  OVar10 = Capability::Client::makeLocalClient
                     ((Client *)(local_5a0 + 8),
                      (Own<capnp::Capability::Server,_std::nullptr_t> *)&local_3a8[0].value);
  uVar1 = local_3a8[0].value.ownFile.content.size_;
  if ((long *)local_3a8[0]._8_8_ != (long *)0x0) {
    local_3a8[0].value.ownFile.content.size_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_3a8[0]._0_8_)
              (local_3a8[0].value.ownFile.content.ptr,uVar1 + *(long *)(*(long *)uVar1 + -0x10),
               OVar10.ptr);
  }
  local_540.ptr.isSet = false;
  TwoPartyServer::TwoPartyServer(&local_448,(Client *)(local_5a0 + 8),&local_540);
  uVar1 = local_540.ptr.field_1.value.impl.ptr;
  if ((local_540.ptr.isSet == true) && (local_540.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_540.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_540.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_540.ptr.field_1.value.impl.disposer,
               (_func_int *)
               ((long)&((Iface *)uVar1)->_vptr_Iface + (long)((Iface *)uVar1)->_vptr_Iface[-2]));
  }
  pEVar3 = local_590;
  if (local_590 != (ErrorHandler *)0x0) {
    local_590 = (ErrorHandler *)0x0;
    (***(_func_int ***)local_5a0._8_8_)
              (local_5a0._8_8_,
               (_func_int *)
               ((long)&pEVar3->_vptr_ErrorHandler + (long)pEVar3->_vptr_ErrorHandler[-2]));
  }
  piVar2 = local_600.right;
  if ((long *)local_600.right != (long *)0x0) {
    local_600.right = (int *)0x0;
    (**((PromiseArenaMember *)local_600._0_8_)->_vptr_PromiseArenaMember)
              (local_600._0_8_,(long)piVar2 + *(long *)(*(long *)piVar2 + -0x10));
  }
  puVar7 = (undefined8 *)(**(code **)(*local_510 + 0x18))();
  (**(code **)*puVar7)(local_3a8,puVar7,"127.0.0.1",10,0);
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_468 = &DAT_004fd5db;
  local_460 = (void *)0x1200000185;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait(&local_618,local_3a8);
  uVar1 = local_3a8[0].value.ownFile.content.ptr;
  if ((PromiseArenaMember *)local_3a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_3a8[0].value.ownFile.content.ptr = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  (**(code **)(*plStack_610 + 0x10))(local_5c0 + 8);
  TwoPartyServer::listen((TwoPartyServer *)local_5c0,(int)&local_448,(int)local_5c0._16_8_);
  puVar7 = (undefined8 *)(**(code **)(*local_510 + 0x18))();
  __flags = (*(*(_func_int ***)local_5c0._16_8_)[2])();
  pcVar8 = (char *)0xa;
  (**(code **)*puVar7)(&local_600,puVar7,"127.0.0.1");
  local_488 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_480 = &DAT_004fd5db;
  local_478 = (void *)0xd0000018b;
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_3a8[0].value,&local_600
            );
  puVar7 = (undefined8 *)
           CONCAT44(local_618.super_PromiseBase.node.ptr._4_4_,
                    local_618.super_PromiseBase.node.ptr._0_4_);
  local_618.super_PromiseBase.node.ptr._0_4_ = local_3a8[0]._0_4_;
  local_618.super_PromiseBase.node.ptr._4_4_ = local_3a8[0]._4_4_;
  plVar6 = (long *)local_3a8[0]._8_8_;
  local_3a8[0].value.ownFile.content.size_ = (long *)0x0;
  if (plStack_610 != (long *)0x0) {
    lVar9 = (long)plStack_610 + *(long *)(*plStack_610 + -0x10);
    plStack_610 = plVar6;
    (**(code **)*puVar7)(puVar7,lVar9);
    plVar6 = plStack_610;
  }
  plStack_610 = plVar6;
  uVar1 = local_3a8[0].value.ownFile.content.size_;
  if ((long *)local_3a8[0]._8_8_ != (long *)0x0) {
    local_3a8[0].value.ownFile.content.size_ = (long *)0x0;
    (*(code *)**(undefined8 **)local_3a8[0]._0_8_)
              (local_3a8[0].value.ownFile.content.ptr,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
  }
  uVar1 = local_600._0_8_;
  if ((PromiseArenaMember *)local_600._0_8_ != (PromiseArenaMember *)0x0) {
    local_600._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  (**(code **)*plStack_610)(local_3a8);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_498 = &DAT_004fd5db;
  local_490 = (void *)0x150000018e;
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_5a8,local_3a8);
  uVar1 = local_3a8[0].value.ownFile.content.ptr;
  if ((PromiseArenaMember *)local_3a8[0]._0_8_ != (PromiseArenaMember *)0x0) {
    local_3a8[0].value.ownFile.content.ptr = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  TwoPartyClient::TwoPartyClient
            ((TwoPartyClient *)&local_3a8[0].value,(AsyncIoStream *)local_5a0._0_8_);
  CVar11 = TwoPartyClient::bootstrap((TwoPartyClient *)local_4f8);
  (**(code **)(*(_func_int **)local_4f8._8_8_ + 0x20))(&local_600,local_4f8._8_8_,CVar11.hook.ptr);
  uVar1 = local_4f8._8_8_;
  local_558._8_4_ = local_600.left;
  local_558._12_4_ = local_600._4_4_;
  plStack_548 = (long *)local_600.right;
  local_558._0_8_ = &Capability::Client::typeinfo;
  if ((_func_int **)local_4f8._8_8_ != (_func_int **)0x0) {
    local_4f8._8_8_ = (_func_int **)0x0;
    (**(code **)*(_func_int **)local_4f8._0_8_)
              (local_4f8._0_8_,uVar1 + *(long *)(*(_func_int **)uVar1 + -0x10));
  }
  local_3c0.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_4f8,(Client *)local_558,&local_3c0);
  *(undefined4 *)local_4f8._16_8_ = 0x7b;
  *(byte *)(local_4f8._16_8_ + 4) = *(byte *)(local_4f8._16_8_ + 4) | 1;
  local_600.result = local_604 == (undefined1  [4])0x0;
  local_600._0_8_ = local_600._0_8_ & 0xffffffff00000000;
  local_600.op.content.ptr = " == ";
  local_600.op.content.size_ = (size_t)&DAT_00000005;
  __buf = extraout_RDX;
  local_600.right = (int *)local_604;
  if ((!local_600.result) && (kj::_::Debug::minSeverity < 3)) {
    local_588._0_8_ = local_588._0_8_ & 0xffffffff00000000;
    pcVar8 = "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount";
    __flags = 0x4fd624;
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x195,ERROR,
               "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
               (char (*) [36])"failed: expected (0) == (callCount)",&local_600,(int *)local_588,
               (int *)local_604);
    __buf = extraout_RDX_00;
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_588,(int)local_4f8,__buf,(size_t)pcVar8,__flags);
  local_4b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puStack_4b0 = &DAT_004fd5db;
  local_4a8 = (void *)0x1300000196;
  uVar14 = 0x1300000196;
  pcVar12 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
  ;
  puVar13 = &DAT_004fd5db;
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             &local_600,local_588);
  pcVar8 = pcStack_568;
  uVar1 = local_588._24_8_;
  if ((WirePointer *)local_588._24_8_ != (WirePointer *)0x0) {
    local_588._24_8_ = (WirePointer *)0x0;
    pcStack_568 = (char *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(uStack_55f,local_560))
              ((undefined8 *)CONCAT71(uStack_55f,local_560),uVar1,8,pcVar8,pcVar8,0,pcVar12,puVar13,
               uVar14);
  }
  if ((PromiseFulfiller<void> *)local_588._16_8_ != (PromiseFulfiller<void> *)0x0) {
    local_588._16_8_ = (PromiseFulfiller<void> *)0x0;
    (***(_func_int ***)local_588._8_8_)();
  }
  uVar1 = local_588._0_8_;
  if ((Task *)local_588._0_8_ != (Task *)0x0) {
    local_588._0_8_ = (Task *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  local_4c0 = "foo";
  local_3e0.capTable = (CapTableReader *)local_600.right;
  local_3e0.pointer = (WirePointer *)local_600.op.content.size_;
  local_3e0.segment = (SegmentReader *)local_600._0_8_;
  local_3e0.nestingLimit = local_5d8;
  if (local_600._36_2_ == 0) {
    local_3e0.capTable = (CapTableReader *)(ArrayDisposer *)0x0;
    local_3e0.pointer = (WirePointer *)0x0;
    local_3e0.segment = (SegmentReader *)(PromiseArenaMember *)0x0;
    local_3e0.nestingLimit = 0x7fffffff;
  }
  local_458 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_3e0,(void *)0x0,0);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_588,
             (DebugExpression<char_const(&)[4]> *)&local_4c0,(Reader *)&local_458);
  if ((local_560 == false) && (kj::_::Debug::minSeverity < 3)) {
    local_3e0.capTable = (CapTableReader *)local_600.right;
    local_3e0.pointer = (WirePointer *)local_600.op.content.size_;
    local_3e0.segment = (SegmentReader *)local_600._0_8_;
    if (local_600._36_2_ == 0) {
      local_5d8 = 0x7fffffff;
      local_3e0.capTable = (CapTableReader *)(ArrayDisposer *)0x0;
      local_3e0.pointer = (WirePointer *)0x0;
      local_3e0.segment = (SegmentReader *)0x0;
    }
    local_3e0.nestingLimit = local_5d8;
    local_458 = (ArrayPtr<const_char>)PointerReader::getBlob<capnp::Text>(&local_3e0,(void *)0x0,0);
    kj::_::Debug::
    log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x197,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", _kjCondition, \"foo\", response.getX()"
               ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
               (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_588,
               (char (*) [4])"foo",(Reader *)&local_458);
  }
  local_588._0_4_ = 1;
  local_588._16_8_ = " == ";
  local_588._24_8_ = &DAT_00000005;
  pcStack_568 = (char *)CONCAT71(pcStack_568._1_7_,local_604 == (undefined1  [4])0x1);
  local_588._8_8_ = (ArrayDisposer *)local_604;
  if ((local_604 != (undefined1  [4])0x1) && (kj::_::Debug::minSeverity < 3)) {
    local_3e0.segment = (SegmentReader *)CONCAT44(local_3e0.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
               ,0x198,ERROR,
               "\"failed: expected \" \"(1) == (callCount)\", _kjCondition, 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",
               (DebugComparison<int,_int_&> *)local_588,(int *)&local_3e0,(int *)local_604);
  }
  plVar6 = local_5c8;
  if (local_5c8 != (long *)0x0) {
    local_5c8 = (long *)0x0;
    (**(code **)*local_5d0)(local_5d0,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  pRVar4 = local_4c8;
  if (local_4c8 != (RequestHook *)0x0) {
    local_4c8 = (RequestHook *)0x0;
    (*(code *)**(undefined8 **)local_4f8._40_8_)
              (local_4f8._40_8_,
               (_func_int *)((long)&pRVar4->_vptr_RequestHook + (long)pRVar4->_vptr_RequestHook[-2])
              );
  }
  plVar6 = plStack_548;
  if (plStack_548 != (long *)0x0) {
    plStack_548 = (long *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_558._12_4_,local_558._8_4_))
              ((undefined8 *)CONCAT44(local_558._12_4_,local_558._8_4_),
               (long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  RpcSystemBase::~RpcSystemBase(&local_40);
  TwoPartyVatNetwork::~TwoPartyVatNetwork((TwoPartyVatNetwork *)&local_3a8[0].value);
  uVar1 = local_5a0._0_8_;
  if ((AsyncIoStream *)local_5a0._0_8_ != (AsyncIoStream *)0x0) {
    local_5a0._0_8_ = (AsyncIoStream *)0x0;
    (**((local_5a8.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember)
              (local_5a8.ptr,
               (_func_int *)
               ((long)&((AsyncInputStream *)uVar1)->_vptr_AsyncInputStream +
               (long)((AsyncInputStream *)uVar1)->_vptr_AsyncInputStream[-2]));
  }
  uVar1 = local_5c0._0_8_;
  if ((PromiseArenaMember *)local_5c0._0_8_ != (PromiseArenaMember *)0x0) {
    local_5c0._0_8_ = (PromiseArenaMember *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar1);
  }
  uVar1 = local_5c0._16_8_;
  if ((ClientHook *)local_5c0._16_8_ != (ClientHook *)0x0) {
    local_5c0._16_8_ = (ClientHook *)0x0;
    (***(_func_int ***)local_5c0._8_8_)
              (local_5c0._8_8_,
               (_func_int *)((long)(_func_int ***)uVar1 + (long)(*(_func_int ***)uVar1)[-2]));
  }
  plVar6 = plStack_610;
  if (plStack_610 != (long *)0x0) {
    plStack_610 = (long *)0x0;
    (*(code *)**(undefined8 **)
                CONCAT44(local_618.super_PromiseBase.node.ptr._4_4_,
                         local_618.super_PromiseBase.node.ptr._0_4_))
              ((undefined8 *)
               CONCAT44(local_618.super_PromiseBase.node.ptr._4_4_,
                        local_618.super_PromiseBase.node.ptr._0_4_),
               (long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  local_448.super_ErrorHandler._vptr_ErrorHandler = (_func_int **)&PTR_taskFailed_006fccc8;
  kj::TaskSet::~TaskSet(&local_448.tasks);
  uVar1 = local_448.traceEncoder.ptr.field_1.value.impl.ptr;
  if ((local_448.traceEncoder.ptr.isSet == true) &&
     (local_448.traceEncoder.ptr.field_1.value.impl.ptr != (Iface *)0x0)) {
    local_448.traceEncoder.ptr.field_1.value.impl.ptr = (Iface *)0x0;
    (**(local_448.traceEncoder.ptr.field_1.value.impl.disposer)->_vptr_Disposer)
              (local_448.traceEncoder.ptr.field_1.value.impl.disposer,
               (_func_int *)
               ((long)&((Iface *)uVar1)->_vptr_Iface + (long)((Iface *)uVar1)->_vptr_Iface[-2]));
  }
  pCVar5 = local_448.bootstrapInterface.hook.ptr;
  if (local_448.bootstrapInterface.hook.ptr != (ClientHook *)0x0) {
    local_448.bootstrapInterface.hook.ptr = (ClientHook *)0x0;
    (**(local_448.bootstrapInterface.hook.disposer)->_vptr_Disposer)
              (local_448.bootstrapInterface.hook.disposer,
               (_func_int *)((long)&pCVar5->_vptr_ClientHook + (long)pCVar5->_vptr_ClientHook[-2]));
  }
  plVar6 = local_510;
  if (local_510 != (long *)0x0) {
    local_510 = (long *)0x0;
    (**(code **)*local_518)(local_518,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  plVar6 = local_520;
  if (local_520 != (long *)0x0) {
    local_520 = (long *)0x0;
    (**(code **)*local_528)(local_528,(long)plVar6 + *(long *)(*plVar6 + -0x10));
  }
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}